

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O3

void sink_info_callback(pa_context *context,pa_sink_info *info,int eol,void *u)

{
  void *__dest;
  
  if (eol == 0) {
    free(*(void **)((long)u + 0x20));
    __dest = malloc(0x8c);
    *(void **)((long)u + 0x20) = __dest;
    memcpy(__dest,&info->channel_map,0x84);
    *(uint32_t *)((long)__dest + 0x84) = (info->sample_spec).rate;
    *(pa_sink_flags_t *)((long)__dest + 0x88) = info->flags;
  }
  (*cubeb_pa_threaded_mainloop_signal)(*(pa_threaded_mainloop **)((long)u + 0x10),0);
  return;
}

Assistant:

static void
sink_info_callback(pa_context * context, const pa_sink_info * info, int eol,
                   void * u)
{
  (void)context;
  cubeb * ctx = u;
  if (!eol) {
    free(ctx->default_sink_info);
    ctx->default_sink_info = malloc(sizeof(struct cubeb_default_sink_info));
    memcpy(&ctx->default_sink_info->channel_map, &info->channel_map,
           sizeof(pa_channel_map));
    ctx->default_sink_info->sample_spec_rate = info->sample_spec.rate;
    ctx->default_sink_info->flags = info->flags;
  }
  WRAP(pa_threaded_mainloop_signal)(ctx->mainloop, 0);
}